

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pack_dev.c
# Opt level: O0

dev_t pack_netbsd(int n,u_long *numbers,char **error)

{
  ulong uVar1;
  dev_t dev;
  char **error_local;
  u_long *numbers_local;
  int n_local;
  
  dev = 0;
  if (n == 2) {
    uVar1 = (*numbers & 0xfff) << 8 | (numbers[1] & 0xfff00) << 0xc;
    dev = uVar1 | numbers[1] & 0xff;
    if ((long)(int)((uint)(uVar1 >> 8) & 0xfff) == *numbers) {
      if ((long)(int)((uint)(numbers[1] & 0xfff00) | (uint)dev & 0xff) != numbers[1]) {
        *error = "invalid minor number";
      }
    }
    else {
      *error = "invalid major number";
    }
  }
  else {
    *error = "too many fields for format";
  }
  return dev;
}

Assistant:

static dev_t
pack_netbsd(int n, u_long numbers[], const char **error)
{
	dev_t dev = 0;

	if (n == 2) {
		dev = makedev_netbsd(numbers[0], numbers[1]);
		if ((u_long)major_netbsd(dev) != numbers[0])
			*error = iMajorError;
		else if ((u_long)minor_netbsd(dev) != numbers[1])
			*error = iMinorError;
	} else
		*error = tooManyFields;
	return (dev);
}